

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O0

buffer_writer * __thiscall buffer_writer::operator<<(buffer_writer *this,uint8_t data)

{
  uint8_t local_11;
  buffer_writer *pbStack_10;
  uint8_t data_local;
  buffer_writer *this_local;
  
  local_11 = data;
  pbStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this->_buffer,&local_11);
  return this;
}

Assistant:

buffer_writer& buffer_writer::operator<<(std::uint8_t data)
{
    _buffer.push_back(data);

    return *this;
}